

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

QStyleOption * __thiscall
QCommonStyle::standardPixmap
          (QCommonStyle *this,StandardPixmap sp,QStyleOption *option,QWidget *widget)

{
  bool bVar1;
  QCommonStylePrivate *this_00;
  ulong uVar2;
  QImage *image;
  QCommonStylePrivate *in_RCX;
  uint in_EDX;
  QStyleOption *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  qreal qVar3;
  QCommonStylePrivate *d;
  QImage im;
  QIcon icon;
  QWidget *in_stack_00000218;
  QStyleOption *in_stack_00000220;
  StandardPixmap in_stack_0000022c;
  QCommonStylePrivate *in_stack_00000230;
  QWidget *in_stack_000003c0;
  QStyleOption *in_stack_000003c8;
  StandardPixmap in_stack_000003d4;
  QCommonStylePrivate *in_stack_000003d8;
  undefined8 in_stack_ffffffffffffff08;
  QStyleOption *option_00;
  undefined4 in_stack_ffffffffffffff20;
  StandardPixmap in_stack_ffffffffffffff24;
  StandardPixmap standardIcon;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  QImage local_98 [24];
  QImage local_80 [24];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  QIcon local_48;
  undefined1 local_40 [8];
  QIcon local_38;
  undefined1 local_30 [8];
  QIcon local_28;
  undefined1 local_20 [8];
  QIcon local_18;
  QIcon local_10;
  long local_8;
  
  standardIcon = (StandardPixmap)((ulong)in_R8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  option_00 = in_RDI;
  this_00 = d_func((QCommonStyle *)0x3e29cb);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_10);
  QCommonStylePrivate::iconFromWindowsTheme
            (in_RCX,standardIcon,(QStyleOption *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  flags.i = (Int)((ulong)in_RCX >> 0x20);
  QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (QIcon *)option_00);
  QIcon::~QIcon(&local_18);
  uVar2 = QIcon::isNull();
  if ((uVar2 & 1) == 0) {
    QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (int)in_stack_ffffffffffffff08);
    qVar3 = QStyleHelper::getDpr((QWidget *)in_RDI);
    QIcon::pixmap((QSize *)in_RDI,qVar3,(Mode)&local_10,(State)local_20);
  }
  else {
    QCommonStylePrivate::iconFromApplicationTheme
              (in_stack_00000230,in_stack_0000022c,in_stack_00000220,in_stack_00000218);
    QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (QIcon *)option_00);
    QIcon::~QIcon(&local_28);
    uVar2 = QIcon::isNull();
    if ((uVar2 & 1) == 0) {
      QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   (int)in_stack_ffffffffffffff08);
      qVar3 = QStyleHelper::getDpr((QWidget *)in_RDI);
      QIcon::pixmap((QSize *)in_RDI,qVar3,(Mode)&local_10,(State)local_30);
    }
    else {
      QCommonStylePrivate::iconFromMacTheme
                (this_00,in_stack_ffffffffffffff24,option_00,(QWidget *)in_RDI);
      QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (QIcon *)option_00);
      QIcon::~QIcon(&local_38);
      uVar2 = QIcon::isNull();
      if ((uVar2 & 1) == 0) {
        QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (int)in_stack_ffffffffffffff08);
        qVar3 = QStyleHelper::getDpr((QWidget *)in_RDI);
        QIcon::pixmap((QSize *)in_RDI,qVar3,(Mode)&local_10,(State)local_40);
      }
      else {
        QCommonStylePrivate::iconFromResourceTheme
                  (in_stack_000003d8,in_stack_000003d4,in_stack_000003c8,in_stack_000003c0);
        QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (QIcon *)option_00);
        QIcon::~QIcon(&local_48);
        uVar2 = QIcon::isNull();
        if ((uVar2 & 1) == 0) {
          QSize::QSize((QSize *)in_RDI,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                       (int)in_stack_ffffffffffffff08);
          qVar3 = QStyleHelper::getDpr((QWidget *)in_RDI);
          QIcon::pixmap((QSize *)in_RDI,qVar3,(Mode)&local_10,(State)local_50);
        }
        else {
          image = (QImage *)(ulong)in_EDX;
          switch(image) {
          case (QImage *)0x0:
            titleBarMenuCachedPixmapFromXPM();
            break;
          case (QImage *)0x1:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x2:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x3:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x4:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x5:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x6:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x7:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x8:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x9:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0xa:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0xb:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0xc:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          default:
            QPixmap::QPixmap((QPixmap *)in_RDI);
            break;
          case (QImage *)0x1b:
            bVar1 = QCommonStylePrivate::rtl(in_RDI);
            if (bVar1) {
              local_68 = &DAT_aaaaaaaaaaaaaaaa;
              local_60 = &DAT_aaaaaaaaaaaaaaaa;
              local_58 = &DAT_aaaaaaaaaaaaaaaa;
              QImage::QImage(local_98,tb_extension_arrow_h_xpm);
              QFlags<Qt::ImageConversionFlag>::QFlags
                        ((QFlags<Qt::ImageConversionFlag> *)in_RDI,
                         (ImageConversionFlag)((ulong)image >> 0x20));
              QImage::convertToFormat
                        ((QImage *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         (Format)((ulong)option_00 >> 0x20),(ImageConversionFlags)flags.i);
              QFlags<Qt::Orientation>::QFlags
                        ((QFlags<Qt::Orientation> *)in_RDI,(Orientation)((ulong)image >> 0x20));
              QImage::flipped((QImage *)this_00,(Orientations)flags.i);
              QImage::~QImage(local_80);
              QImage::~QImage(local_98);
              QFlags<Qt::ImageConversionFlag>::QFlags
                        ((QFlags<Qt::ImageConversionFlag> *)in_RDI,
                         (ImageConversionFlag)((ulong)image >> 0x20));
              QPixmap::fromImage(image,(QFlagsStorageHelper<Qt::ImageConversionFlag,_4>)
                                       SUB84((ulong)option_00 >> 0x20,0));
              QImage::~QImage((QImage *)&local_68);
            }
            else {
              cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                    in_stack_ffffffffffffff20));
            }
            break;
          case (QImage *)0x1c:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x1d:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
            break;
          case (QImage *)0x1e:
            cachedPixmapFromXPM((char **)CONCAT44(in_stack_ffffffffffffff24,
                                                  in_stack_ffffffffffffff20));
          }
        }
      }
    }
  }
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return option_00;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QCommonStyle::standardPixmap(StandardPixmap sp, const QStyleOption *option,
                                     const QWidget *widget) const
{
    Q_D(const QCommonStyle);
    QIcon icon;

    icon = d->iconFromWindowsTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromApplicationTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromMacTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromResourceTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

#ifndef QT_NO_IMAGEFORMAT_XPM
    switch (sp) {
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        if (d->rtl(option)) {
            auto im = QImage(tb_extension_arrow_h_xpm).convertToFormat(QImage::Format_ARGB32).flipped(Qt::Horizontal);
            return QPixmap::fromImage(std::move(im));
        }
        return cachedPixmapFromXPM(tb_extension_arrow_h_xpm);
    case QStyle::SP_ToolBarVerticalExtensionButton:
        return cachedPixmapFromXPM(tb_extension_arrow_v_xpm);
    case QStyle::SP_FileDialogStart:
        return cachedPixmapFromXPM(filedialog_start_xpm);
    case QStyle::SP_FileDialogEnd:
        return cachedPixmapFromXPM(filedialog_end_xpm);
    case QStyle::SP_TitleBarMenuButton:
        return titleBarMenuCachedPixmapFromXPM();
    case QStyle::SP_TitleBarShadeButton:
        return cachedPixmapFromXPM(qt_shade_xpm);
    case QStyle::SP_TitleBarUnshadeButton:
        return cachedPixmapFromXPM(qt_unshade_xpm);
    case QStyle::SP_TitleBarNormalButton:
        return cachedPixmapFromXPM(qt_normalizeup_xpm);
    case QStyle::SP_TitleBarMinButton:
        return cachedPixmapFromXPM(qt_minimize_xpm);
    case QStyle::SP_TitleBarMaxButton:
        return cachedPixmapFromXPM(qt_maximize_xpm);
    case QStyle::SP_TitleBarCloseButton:
        return cachedPixmapFromXPM(qt_close_xpm);
    case QStyle::SP_TitleBarContextHelpButton:
        return cachedPixmapFromXPM(qt_help_xpm);
    case QStyle::SP_DockWidgetCloseButton:
        return cachedPixmapFromXPM(dock_widget_close_xpm);
    case QStyle::SP_MessageBoxInformation:
        return cachedPixmapFromXPM(information_xpm);
    case QStyle::SP_MessageBoxWarning:
        return cachedPixmapFromXPM(warning_xpm);
    case QStyle::SP_MessageBoxCritical:
        return cachedPixmapFromXPM(critical_xpm);
    case QStyle::SP_MessageBoxQuestion:
        return cachedPixmapFromXPM(question_xpm);
    default:
        break;
    }
#endif //QT_NO_IMAGEFORMAT_XPM

    return QPixmap();
}